

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auto_map.cpp
# Opt level: O1

void __thiscall CTilesetMapper::Load(CTilesetMapper *this,json_value *rElement)

{
  json_type jVar1;
  json_object_entry *pjVar2;
  int iVar3;
  _json_value *p_Var4;
  _json_value *p_Var5;
  _json_value *p_Var6;
  _json_value *p_Var7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  char *a;
  ulong uVar11;
  ulong uVar12;
  long in_FS_OFFSET;
  bool bVar13;
  bool bVar14;
  CRuleCondition Condition;
  CRuleSet NewRuleSet;
  CRuleCondition local_104;
  CRule local_f8;
  CRuleSet local_d0;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((rElement->u).boolean != 0) {
    uVar8 = 0;
    do {
      p_Var4 = &json_value_none;
      iVar3 = (int)uVar8;
      if ((-1 < iVar3) && (p_Var4 = &json_value_none, rElement->type == json_array)) {
        p_Var4 = *(_json_value **)((rElement->u).string.ptr + uVar8 * 8);
      }
      if ((p_Var4->u).boolean == 1) {
        local_d0.m_aRules.list = (CRule *)0x0;
        local_d0.m_aRules.list_size = 1;
        local_d0.m_aRules.list = allocator_default<CTilesetMapper::CRule>::alloc_array(1);
        local_d0.m_aRules.num_elements = 0;
        p_Var4 = &json_value_none;
        if (((-1 < iVar3) && (p_Var4 = &json_value_none, rElement->type == json_array)) &&
           (p_Var4 = &json_value_none, uVar8 < (rElement->u).string.length)) {
          p_Var4 = *(_json_value **)((rElement->u).string.ptr + uVar8 * 8);
        }
        str_copy(local_d0.m_aName,((p_Var4->u).object.values)->name,0x80);
        p_Var4 = &json_value_none;
        if (((-1 < iVar3) && (p_Var4 = &json_value_none, rElement->type == json_array)) &&
           (p_Var4 = &json_value_none, uVar8 < (rElement->u).string.length)) {
          p_Var4 = *(_json_value **)((rElement->u).string.ptr + uVar8 * 8);
        }
        p_Var4 = ((p_Var4->u).object.values)->value;
        jVar1 = p_Var4->type;
        p_Var5 = &json_value_none;
        if (jVar1 == json_object) {
          uVar12 = (ulong)(p_Var4->u).string.length;
          p_Var5 = &json_value_none;
          if (uVar12 != 0) {
            pjVar2 = (p_Var4->u).object.values;
            lVar10 = 0;
            do {
              iVar3 = strcmp(*(char **)((long)&pjVar2->name + lVar10),"basetile");
              if (iVar3 == 0) {
                p_Var5 = *(_json_value **)((long)&pjVar2->value + lVar10);
                goto LAB_0018fdb3;
              }
              lVar10 = lVar10 + 0x18;
            } while (uVar12 * 0x18 != lVar10);
            p_Var5 = &json_value_none;
          }
        }
LAB_0018fdb3:
        if (p_Var5->type == json_integer) {
          local_d0.m_BaseTile = (p_Var5->u).boolean;
          if (0xfe < local_d0.m_BaseTile) {
            local_d0.m_BaseTile = 0xff;
          }
          if (local_d0.m_BaseTile < 1) {
            local_d0.m_BaseTile = 0;
          }
        }
        else {
          local_d0.m_BaseTile = 1;
        }
        p_Var5 = &json_value_none;
        if (jVar1 == json_object) {
          uVar12 = (ulong)(p_Var4->u).string.length;
          p_Var5 = &json_value_none;
          if (uVar12 != 0) {
            pjVar2 = (p_Var4->u).object.values;
            lVar10 = 0;
            do {
              iVar3 = strcmp(*(char **)((long)&pjVar2->name + lVar10),"rules");
              if (iVar3 == 0) {
                p_Var5 = *(_json_value **)((long)&pjVar2->value + lVar10);
                goto LAB_0018fe2d;
              }
              lVar10 = lVar10 + 0x18;
            } while (uVar12 * 0x18 != lVar10);
            p_Var5 = &json_value_none;
          }
        }
LAB_0018fe2d:
        if ((p_Var5->u).boolean != 0) {
          uVar12 = 0;
          do {
            local_f8.m_aConditions.list = (CRuleCondition *)0x0;
            local_f8.m_aConditions.list_size = 1;
            local_f8.m_aConditions.list = (CRuleCondition *)operator_new__(0xc);
            local_f8.m_aConditions.num_elements = 0;
            jVar1 = p_Var5->type;
            bVar13 = uVar12 < (p_Var5->u).string.length;
            p_Var4 = &json_value_none;
            if (bVar13 && jVar1 == json_array) {
              p_Var4 = *(_json_value **)((p_Var5->u).string.ptr + uVar12 * 8);
            }
            p_Var6 = &json_value_none;
            if (p_Var4->type == json_object) {
              uVar11 = (ulong)(p_Var4->u).string.length;
              p_Var6 = &json_value_none;
              if (uVar11 != 0) {
                pjVar2 = (p_Var4->u).object.values;
                lVar10 = 0;
                do {
                  iVar3 = strcmp(*(char **)((long)&pjVar2->name + lVar10),"index");
                  if (iVar3 == 0) {
                    p_Var6 = *(_json_value **)((long)&pjVar2->value + lVar10);
                    goto LAB_0018feeb;
                  }
                  lVar10 = lVar10 + 0x18;
                } while (uVar11 * 0x18 != lVar10);
                p_Var6 = &json_value_none;
              }
            }
LAB_0018feeb:
            local_f8.m_Index = 1;
            if (p_Var6->type == json_integer) {
              local_f8.m_Index = (p_Var6->u).boolean;
              if (0xfe < local_f8.m_Index) {
                local_f8.m_Index = 0xff;
              }
              if (local_f8.m_Index < 1) {
                local_f8.m_Index = 0;
              }
            }
            p_Var4 = &json_value_none;
            if (bVar13 && jVar1 == json_array) {
              p_Var4 = *(_json_value **)((p_Var5->u).string.ptr + uVar12 * 8);
            }
            p_Var6 = &json_value_none;
            if (p_Var4->type == json_object) {
              uVar11 = (ulong)(p_Var4->u).string.length;
              p_Var6 = &json_value_none;
              if (uVar11 != 0) {
                pjVar2 = (p_Var4->u).object.values;
                lVar10 = 0;
                do {
                  iVar3 = strcmp(*(char **)((long)&pjVar2->name + lVar10),"random");
                  if (iVar3 == 0) {
                    p_Var6 = *(_json_value **)((long)&pjVar2->value + lVar10);
                    goto LAB_0018ff7b;
                  }
                  lVar10 = lVar10 + 0x18;
                } while (uVar11 * 0x18 != lVar10);
                p_Var6 = &json_value_none;
              }
            }
LAB_0018ff7b:
            if (p_Var6->type == json_integer) {
              local_f8.m_Random = (p_Var6->u).boolean;
              if (0x1869e < local_f8.m_Random) {
                local_f8.m_Random = 99999;
              }
              if (local_f8.m_Random < 1) {
                local_f8.m_Random = 0;
              }
            }
            else {
              local_f8.m_Random = 0;
            }
            p_Var4 = &json_value_none;
            if ((jVar1 == json_array) &&
               (p_Var4 = &json_value_none, uVar12 < (p_Var5->u).string.length)) {
              p_Var4 = *(_json_value **)((p_Var5->u).string.ptr + uVar12 * 8);
            }
            p_Var6 = &json_value_none;
            if (p_Var4->type == json_object) {
              uVar11 = (ulong)(p_Var4->u).string.length;
              p_Var6 = &json_value_none;
              if (uVar11 != 0) {
                pjVar2 = (p_Var4->u).object.values;
                lVar10 = 0;
                do {
                  iVar3 = strcmp(*(char **)((long)&pjVar2->name + lVar10),"rotate");
                  if (iVar3 == 0) {
                    p_Var6 = *(_json_value **)((long)&pjVar2->value + lVar10);
                    goto LAB_00190015;
                  }
                  lVar10 = lVar10 + 0x18;
                } while (uVar11 * 0x18 != lVar10);
                p_Var6 = &json_value_none;
              }
            }
LAB_00190015:
            if ((p_Var6->type == json_integer) &&
               (((lVar10 = (p_Var6->u).integer, lVar10 == 0x5a || (lVar10 == 0x10e)) ||
                (lVar10 == 0xb4)))) {
              local_f8.m_Rotation = (int)lVar10;
            }
            else {
              local_f8.m_Rotation = 0;
            }
            p_Var4 = &json_value_none;
            if ((jVar1 == json_array) &&
               (p_Var4 = &json_value_none, uVar12 < (p_Var5->u).string.length)) {
              p_Var4 = *(_json_value **)((p_Var5->u).string.ptr + uVar12 * 8);
            }
            p_Var6 = &json_value_none;
            if (p_Var4->type == json_object) {
              uVar11 = (ulong)(p_Var4->u).string.length;
              p_Var6 = &json_value_none;
              if (uVar11 != 0) {
                pjVar2 = (p_Var4->u).object.values;
                lVar10 = 0;
                do {
                  iVar3 = strcmp(*(char **)((long)&pjVar2->name + lVar10),"hflip");
                  if (iVar3 == 0) {
                    p_Var6 = *(_json_value **)((long)&pjVar2->value + lVar10);
                    goto LAB_001900b2;
                  }
                  lVar10 = lVar10 + 0x18;
                } while (uVar11 * 0x18 != lVar10);
                p_Var6 = &json_value_none;
              }
            }
LAB_001900b2:
            if (p_Var6->type == json_integer) {
              local_f8.m_HFlip = (int)(0 < (p_Var6->u).boolean);
            }
            else {
              local_f8.m_HFlip = 0;
            }
            p_Var4 = &json_value_none;
            if ((jVar1 == json_array) &&
               (p_Var4 = &json_value_none, uVar12 < (p_Var5->u).string.length)) {
              p_Var4 = *(_json_value **)((p_Var5->u).string.ptr + uVar12 * 8);
            }
            p_Var6 = &json_value_none;
            if (p_Var4->type == json_object) {
              uVar11 = (ulong)(p_Var4->u).string.length;
              p_Var6 = &json_value_none;
              if (uVar11 != 0) {
                pjVar2 = (p_Var4->u).object.values;
                lVar10 = 0;
                do {
                  iVar3 = strcmp(*(char **)((long)&pjVar2->name + lVar10),"vflip");
                  if (iVar3 == 0) {
                    p_Var6 = *(_json_value **)((long)&pjVar2->value + lVar10);
                    goto LAB_0019013a;
                  }
                  lVar10 = lVar10 + 0x18;
                } while (uVar11 * 0x18 != lVar10);
                p_Var6 = &json_value_none;
              }
            }
LAB_0019013a:
            if (p_Var6->type == json_integer) {
              local_f8.m_VFlip = (int)(0 < (p_Var6->u).boolean);
            }
            else {
              local_f8.m_VFlip = 0;
            }
            p_Var4 = &json_value_none;
            if ((jVar1 == json_array) &&
               (p_Var4 = &json_value_none, uVar12 < (p_Var5->u).string.length)) {
              p_Var4 = *(_json_value **)((p_Var5->u).string.ptr + uVar12 * 8);
            }
            p_Var6 = &json_value_none;
            if (p_Var4->type == json_object) {
              uVar11 = (ulong)(p_Var4->u).string.length;
              p_Var6 = &json_value_none;
              if (uVar11 != 0) {
                pjVar2 = (p_Var4->u).object.values;
                lVar10 = 0;
                do {
                  iVar3 = strcmp(*(char **)((long)&pjVar2->name + lVar10),"condition");
                  if (iVar3 == 0) {
                    p_Var6 = *(_json_value **)((long)&pjVar2->value + lVar10);
                    goto LAB_001901bf;
                  }
                  lVar10 = lVar10 + 0x18;
                } while (uVar11 * 0x18 != lVar10);
                p_Var6 = &json_value_none;
              }
            }
LAB_001901bf:
            if ((p_Var6->type == json_array) && ((p_Var6->u).boolean != 0)) {
              uVar11 = 0;
              do {
                bVar13 = p_Var6->type == json_array;
                bVar14 = -1 < (int)uVar11;
                p_Var4 = &json_value_none;
                if (bVar14 && bVar13) {
                  p_Var4 = *(_json_value **)((p_Var6->u).string.ptr + uVar11 * 8);
                }
                p_Var7 = &json_value_none;
                if (p_Var4->type == json_object) {
                  uVar9 = (ulong)(p_Var4->u).string.length;
                  p_Var7 = &json_value_none;
                  if (uVar9 != 0) {
                    pjVar2 = (p_Var4->u).object.values;
                    lVar10 = 0;
                    do {
                      iVar3 = strcmp(*(char **)((long)&pjVar2->name + lVar10),"x");
                      if (iVar3 == 0) {
                        p_Var7 = *(_json_value **)((long)&pjVar2->value + lVar10);
                        goto LAB_00190258;
                      }
                      lVar10 = lVar10 + 0x18;
                    } while (uVar9 * 0x18 != lVar10);
                    p_Var7 = &json_value_none;
                  }
                }
LAB_00190258:
                local_104.m_X = (p_Var7->u).boolean;
                p_Var4 = &json_value_none;
                if (bVar14 && bVar13) {
                  p_Var4 = *(_json_value **)((p_Var6->u).string.ptr + uVar11 * 8);
                }
                p_Var7 = &json_value_none;
                if (p_Var4->type == json_object) {
                  uVar9 = (ulong)(p_Var4->u).string.length;
                  p_Var7 = &json_value_none;
                  if (uVar9 != 0) {
                    pjVar2 = (p_Var4->u).object.values;
                    lVar10 = 0;
                    do {
                      iVar3 = strcmp(*(char **)((long)&pjVar2->name + lVar10),"y");
                      if (iVar3 == 0) {
                        p_Var7 = *(_json_value **)((long)&pjVar2->value + lVar10);
                        goto LAB_001902c9;
                      }
                      lVar10 = lVar10 + 0x18;
                    } while (uVar9 * 0x18 != lVar10);
                    p_Var7 = &json_value_none;
                  }
                }
LAB_001902c9:
                local_104.m_Y = (p_Var7->u).boolean;
                p_Var4 = &json_value_none;
                if (bVar14 && bVar13) {
                  p_Var4 = *(_json_value **)((p_Var6->u).string.ptr + uVar11 * 8);
                }
                p_Var7 = &json_value_none;
                if (p_Var4->type == json_object) {
                  uVar9 = (ulong)(p_Var4->u).string.length;
                  p_Var7 = &json_value_none;
                  if (uVar9 != 0) {
                    pjVar2 = (p_Var4->u).object.values;
                    lVar10 = 0;
                    do {
                      iVar3 = strcmp(*(char **)((long)&pjVar2->name + lVar10),"value");
                      if (iVar3 == 0) {
                        p_Var7 = *(_json_value **)((long)&pjVar2->value + lVar10);
                        goto LAB_0019033d;
                      }
                      lVar10 = lVar10 + 0x18;
                    } while (uVar9 * 0x18 != lVar10);
                    p_Var7 = &json_value_none;
                  }
                }
LAB_0019033d:
                jVar1 = p_Var7->type;
                if (jVar1 == json_integer) {
                  local_104.m_Value = (p_Var7->u).boolean;
                  if (0xfe < local_104.m_Value) {
                    local_104.m_Value = 0xff;
                  }
                  if (local_104.m_Value < -1) {
                    local_104.m_Value = -2;
                  }
                }
                else {
                  if (jVar1 == json_string) {
                    a = "";
                    if (jVar1 == json_string) {
                      a = (p_Var7->u).string.ptr;
                    }
                    iVar3 = str_comp(a,"full");
                    if (iVar3 == 0) {
                      local_104.m_Value = -1;
                      goto LAB_00190397;
                    }
                  }
                  local_104.m_Value = -2;
                }
LAB_00190397:
                array<CTilesetMapper::CRuleCondition,_allocator_default<CTilesetMapper::CRuleCondition>_>
                ::add(&local_f8.m_aConditions,&local_104);
                uVar11 = uVar11 + 1;
              } while (uVar11 < (p_Var6->u).string.length);
            }
            array<CTilesetMapper::CRule,_allocator_default<CTilesetMapper::CRule>_>::add
                      (&local_d0.m_aRules,&local_f8);
            if (local_f8.m_aConditions.list != (CRuleCondition *)0x0) {
              operator_delete__(local_f8.m_aConditions.list);
            }
          } while ((uVar12 < 0xff) && (uVar12 = uVar12 + 1, uVar12 < (p_Var5->u).string.length));
        }
        array<CTilesetMapper::CRuleSet,_allocator_default<CTilesetMapper::CRuleSet>_>::add
                  (&this->m_aRuleSets,&local_d0);
        allocator_default<CTilesetMapper::CRule>::free_array(local_d0.m_aRules.list);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < (rElement->u).string.length);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CTilesetMapper::Load(const json_value &rElement)
{
	for(unsigned i = 0; i < rElement.u.array.length; ++i)
	{
		if(rElement[i].u.object.length != 1)
			continue;

		// new rule set
		CRuleSet NewRuleSet;
		const char* pConfName = rElement[i].u.object.values[0].name;
		str_copy(NewRuleSet.m_aName, pConfName, sizeof(NewRuleSet.m_aName));
		const json_value &rStart = *(rElement[i].u.object.values[0].value);

		// get basetile
		const json_value &rBasetile = rStart["basetile"];
		if(rBasetile.type == json_integer)
			NewRuleSet.m_BaseTile = clamp((int)rBasetile.u.integer, 0, 255);
		else
			NewRuleSet.m_BaseTile = 1;

		// get rules
		const json_value &rRuleNode = rStart["rules"];
		for(unsigned j = 0; j < rRuleNode.u.array.length && j < MAX_RULES; j++)
		{
			// create a new rule
			CRule NewRule;

			// index
			const json_value &rIndex = rRuleNode[j]["index"];
			if(rIndex.type == json_integer)
				NewRule.m_Index = clamp((int)rIndex.u.integer, 0, 255);
			else
				NewRule.m_Index = 1;

			// random
			const json_value &rRandom = rRuleNode[j]["random"];
			if(rRandom.type == json_integer)
				NewRule.m_Random = clamp((int)rRandom.u.integer, 0, 99999);
			else
				NewRule.m_Random = 0;

			// rotate
			const json_value &rRotate = rRuleNode[j]["rotate"];
			if(rRotate.type == json_integer && (rRotate.u.integer == 90 || rRotate.u.integer == 180 || rRotate.u.integer == 270))
				NewRule.m_Rotation = rRotate.u.integer;
			else
				NewRule.m_Rotation = 0;

			// hflip
			const json_value &rHFlip = rRuleNode[j]["hflip"];
			if(rHFlip.type == json_integer)
				NewRule.m_HFlip = clamp((int)rHFlip.u.integer, 0, 1);
			else
				NewRule.m_HFlip = 0;

			// vflip
			const json_value &rVFlip = rRuleNode[j]["vflip"];
			if(rVFlip.type == json_integer)
				NewRule.m_VFlip = clamp((int)rVFlip.u.integer, 0, 1);
			else
				NewRule.m_VFlip = 0;

			// get rule's content
			const json_value &rCondition = rRuleNode[j]["condition"];
			if(rCondition.type == json_array)
			{
				for(unsigned k = 0; k < rCondition.u.array.length; k++)
				{
					CRuleCondition Condition;

					Condition.m_X = rCondition[k]["x"].u.integer;
					Condition.m_Y = rCondition[k]["y"].u.integer;
					const json_value &rValue = rCondition[k]["value"];
					if(rValue.type == json_string)
					{
						// the value is not an index, check if it's full or empty
						if(str_comp((const char *)rValue, "full") == 0)
							Condition.m_Value = CRuleCondition::FULL;
						else
							Condition.m_Value = CRuleCondition::EMPTY;
					}
					else if(rValue.type == json_integer)
						Condition.m_Value = clamp((int)rValue.u.integer, (int)CRuleCondition::EMPTY, 255);
					else
						Condition.m_Value = CRuleCondition::EMPTY;

					NewRule.m_aConditions.add(Condition);
				}
			}

			NewRuleSet.m_aRules.add(NewRule);
		}

		m_aRuleSets.add(NewRuleSet);
	}
}